

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::(anonymous_namespace)::SymbolProperties::Demangle_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *symbol)

{
  void *__ptr;
  char *pcVar1;
  char *local_68;
  char *demangledSymbol;
  char *buffer;
  size_t bufferLen;
  int status;
  allocator local_22;
  undefined1 local_21;
  char *local_20;
  char *symbol_local;
  SymbolProperties *this_local;
  string *result;
  
  local_21 = 0;
  local_68 = symbol;
  if (symbol == (char *)0x0) {
    local_68 = "???";
  }
  local_20 = symbol;
  symbol_local = (char *)this;
  this_local = (SymbolProperties *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_68,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  bufferLen._0_4_ = 0;
  buffer = (char *)0x400;
  __ptr = malloc(0x400);
  pcVar1 = (char *)__cxa_demangle(local_20,__ptr,&buffer,&bufferLen);
  if ((int)bufferLen == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar1);
  }
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::Demangle(const char* symbol) const
{
  std::string result = safes(symbol);
#if defined(KWSYS_SYSTEMINFORMATION_HAS_CPP_DEMANGLE)
  int status = 0;
  size_t bufferLen = 1024;
  char* buffer = (char*)malloc(1024);
  char* demangledSymbol =
    abi::__cxa_demangle(symbol, buffer, &bufferLen, &status);
  if (!status) {
    result = demangledSymbol;
  }
  free(buffer);
#else
  (void)symbol;
#endif
  return result;
}